

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

ostream * doctest::detail::getTlsOss(bool reset)

{
  long lVar1;
  ostream *poVar2;
  undefined7 in_register_00000039;
  long *in_FS_OFFSET;
  long *local_40 [2];
  long local_30 [2];
  
  if ((int)CONCAT71(in_register_00000039,reset) == 0) {
    poVar2 = (ostream *)(*in_FS_OFFSET + -0x1b8);
  }
  else {
    g_infoContexts::__tls_init();
    lVar1 = *in_FS_OFFSET;
    poVar2 = (ostream *)(lVar1 + -0x1b8);
    std::ios::clear((int)*(undefined8 *)(in_FS_OFFSET[-0x37] + -0x18) + (int)poVar2);
    g_infoContexts::__tls_init();
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
    std::__cxx11::stringbuf::str((string *)(lVar1 + -0x1b0));
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  g_infoContexts::__tls_init();
  return poVar2;
}

Assistant:

std::ostream* getTlsOss(bool reset) {
        if(reset) {
          g_oss.clear(); // there shouldn't be anything worth clearing in the flags
          g_oss.str(""); // the slow way of resetting a string stream
          //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
	}
        return &g_oss;
    }